

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# label.cpp
# Opt level: O2

void __thiscall
vera::Label::Label(Label *this,string *_text,Node *_node,LabelType _type,float _margin)

{
  (this->super_BoundingBox).min.field_0 =
       (anon_union_4_3_4e90da17_for_vec<3,_float,_(glm::qualifier)0>_3)0x7f7fffff;
  (this->super_BoundingBox).min.field_1 =
       (anon_union_4_3_4e90b0ec_for_vec<3,_float,_(glm::qualifier)0>_5)0x7f7fffff;
  *(undefined8 *)&(this->super_BoundingBox).min.field_2 = 0x8000007f7fffff;
  (this->super_BoundingBox).max.field_1 =
       (anon_union_4_3_4e90b0ec_for_vec<3,_float,_(glm::qualifier)0>_5)0x800000;
  (this->super_BoundingBox).max.field_2 =
       (anon_union_4_3_4e909dac_for_vec<3,_float,_(glm::qualifier)0>_7)0x800000;
  this->_vptr_Label = (_func_int **)&PTR_getScreenPosition_003ded58;
  *(undefined8 *)&(this->m_textFunc).super__Function_base._M_functor = 0;
  *(undefined8 *)((long)&(this->m_textFunc).super__Function_base._M_functor + 8) = 0;
  (this->m_textFunc).super__Function_base._M_manager = (_Manager_type)0x0;
  (this->m_textFunc)._M_invoker = (_Invoker_type)0x0;
  (this->m_text)._M_dataplus._M_p = (pointer)&(this->m_text).field_2;
  (this->m_text)._M_string_length = 0;
  (this->m_text).field_2._M_local_buf[0] = '\0';
  (this->m_screenBox).min.field_0 =
       (anon_union_4_3_4e90da17_for_vec<3,_float,_(glm::qualifier)0>_3)0x7f7fffff;
  (this->m_screenBox).min.field_1 =
       (anon_union_4_3_4e90b0ec_for_vec<3,_float,_(glm::qualifier)0>_5)0x7f7fffff;
  *(undefined8 *)&(this->m_screenBox).min.field_2 = 0x8000007f7fffff;
  (this->m_screenBox).max.field_1 =
       (anon_union_4_3_4e90b0ec_for_vec<3,_float,_(glm::qualifier)0>_5)0x800000;
  (this->m_screenBox).max.field_2 =
       (anon_union_4_3_4e909dac_for_vec<3,_float,_(glm::qualifier)0>_7)0x800000;
  this->m_bbox = (BoundingBox *)0x0;
  std::__cxx11::string::_M_assign((string *)&this->m_text);
  this->m_worldPos = &_node->m_position;
  this->m_type = _type;
  setMargin(this,_margin);
  return;
}

Assistant:

Label::Label(const std::string& _text, Node* _node, LabelType _type, float _margin) : m_bbox(nullptr) { 
    setText(_text);
    linkTo(_node);
    setType(_type);
    setMargin(_margin);
}